

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::Render(void)

{
  ImDrawDataBuilder *out_list;
  ImVec2 IVar1;
  uint uVar2;
  ImGuiWindow *pIVar3;
  ImTextureID texture_id;
  ImDrawList *pIVar4;
  _func_void_ImDrawData_ptr *p_Var5;
  ImGuiContext *pIVar6;
  bool bVar7;
  value_type *ppIVar8;
  ImDrawList **ppIVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ImGuiWindow *window;
  int n;
  int iVar13;
  float fVar14;
  float fVar15;
  ImVec2 uv [4];
  ImVec2 pos;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 IStack_a0;
  ImVec2 local_98;
  ImVec2 IStack_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  ImVec2 local_68;
  ImVec2 local_60;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pIVar6 = GImGui;
  if (GImGui->Initialized != false) {
    iVar13 = GImGui->FrameCountEnded;
    if (iVar13 != GImGui->FrameCount) {
      EndFrame();
      iVar13 = pIVar6->FrameCount;
    }
    pIVar6->FrameCountRendered = iVar13;
    (pIVar6->IO).MetricsActiveWindows = 0;
    (pIVar6->IO).MetricsRenderVertices = 0;
    (pIVar6->IO).MetricsRenderIndices = 0;
    out_list = &pIVar6->DrawDataBuilder;
    ImDrawDataBuilder::Clear(out_list);
    pIVar3 = pIVar6->NavWindowingTarget;
    iVar13 = 0;
    window = (ImGuiWindow *)0x0;
    if ((pIVar3 != (ImGuiWindow *)0x0) && ((pIVar3->Flags & 0x2000) == 0)) {
      window = pIVar3;
    }
    for (; iVar13 != (pIVar6->Windows).Size; iVar13 = iVar13 + 1) {
      ppIVar8 = ImVector<ImGuiWindow_*>::operator[](&pIVar6->Windows,iVar13);
      pIVar3 = *ppIVar8;
      if (((pIVar3->Active == true) && (pIVar3->HiddenFrames == 0)) &&
         ((pIVar3 != window && ((pIVar3->Flags & 0x1000000U) == 0)))) {
        AddWindowToDrawDataSelectLayer(pIVar3);
      }
    }
    if (((window != (ImGuiWindow *)0x0) && (window->Active == true)) && (window->HiddenFrames == 0))
    {
      AddWindowToDrawDataSelectLayer(window);
    }
    ImDrawDataBuilder::FlattenIntoSingleLayer(out_list);
    local_b0.x = 0.0;
    local_b0.y = 0.0;
    local_c0.x = 0.0;
    local_c0.y = 0.0;
    local_98.x = 0.0;
    local_98.y = 0.0;
    IStack_90.x = 0.0;
    IStack_90.y = 0.0;
    local_a8.x = 0.0;
    local_a8.y = 0.0;
    IStack_a0.x = 0.0;
    IStack_a0.y = 0.0;
    if ((pIVar6->IO).MouseDrawCursor == true) {
      bVar7 = ImFontAtlas::GetMouseCursorTexData
                        ((pIVar6->IO).Fonts,pIVar6->MouseCursor,&local_b0,&local_c0,&local_a8,
                         &local_98);
      if (bVar7) {
        IVar1 = (pIVar6->IO).MousePos;
        fVar14 = IVar1.x - local_b0.x;
        fVar15 = IVar1.y - local_b0.y;
        local_78 = CONCAT44(fVar15,fVar14);
        uStack_70 = 0;
        local_60.y = fVar15;
        local_60.x = fVar14;
        texture_id = ((pIVar6->IO).Fonts)->TexID;
        local_58 = ZEXT416((uint)(pIVar6->Style).MouseCursorScale);
        pIVar4 = &pIVar6->OverlayDrawList;
        ImDrawList::PushTextureID(pIVar4,texture_id);
        local_48 = (float)local_58._0_4_ + (float)local_78;
        fStack_44 = (float)local_58._0_4_ * 0.0 + local_78._4_4_;
        fStack_40 = (float)local_58._4_4_ + (float)uStack_70;
        fStack_3c = uStack_70._4_4_ + 0.0;
        local_b8.y = fStack_44;
        local_b8.x = local_48;
        local_88 = (float)local_58._0_4_;
        fStack_84 = (float)local_58._0_4_;
        fStack_80 = (float)local_58._0_4_;
        fStack_7c = (float)local_58._0_4_;
        local_68.y = local_c0.y * (float)local_58._0_4_ + fStack_44;
        local_68.x = local_c0.x * (float)local_58._0_4_ + local_48;
        ImDrawList::AddImage(pIVar4,texture_id,&local_b8,&local_68,&local_98,&IStack_90,0x30000000);
        fVar14 = (float)local_58._0_4_ + (float)local_58._0_4_ + (float)local_78;
        local_b8.y = fStack_44;
        local_b8.x = fVar14;
        local_68.y = local_c0.y * fStack_84 + fStack_44;
        local_68.x = local_c0.x * local_88 + fVar14;
        ImDrawList::AddImage(pIVar4,texture_id,&local_b8,&local_68,&local_98,&IStack_90,0x30000000);
        local_b8.y = local_c0.y * fStack_84 + local_78._4_4_;
        local_b8.x = local_c0.x * local_88 + (float)local_78;
        ImDrawList::AddImage(pIVar4,texture_id,&local_60,&local_b8,&local_98,&IStack_90,0xff000000);
        local_b8.y = local_60.y + local_c0.y * fStack_84;
        local_b8.x = local_60.x + local_c0.x * local_88;
        ImDrawList::AddImage(pIVar4,texture_id,&local_60,&local_b8,&local_a8,&IStack_a0,0xffffffff);
        ImDrawList::PopTextureID(pIVar4);
      }
    }
    if ((pIVar6->OverlayDrawList).VtxBuffer.Size != 0) {
      AddDrawListToDrawData(out_list->Layers,&pIVar6->OverlayDrawList);
    }
    (pIVar6->DrawData).Valid = true;
    uVar2 = (pIVar6->DrawDataBuilder).Layers[0].Size;
    iVar13 = 0;
    if ((int)uVar2 < 1) {
      ppIVar9 = (ImDrawList **)0x0;
    }
    else {
      ppIVar9 = (pIVar6->DrawDataBuilder).Layers[0].Data;
    }
    (pIVar6->DrawData).CmdLists = ppIVar9;
    (pIVar6->DrawData).CmdListsCount = uVar2;
    (pIVar6->DrawData).TotalIdxCount = 0;
    (pIVar6->DrawData).TotalVtxCount = 0;
    uVar10 = 0;
    if (0 < (int)uVar2) {
      uVar10 = (ulong)uVar2;
    }
    iVar11 = 0;
    uVar12 = 0;
    while( true ) {
      if (uVar10 == uVar12) break;
      pIVar4 = (pIVar6->DrawDataBuilder).Layers[0].Data[uVar12];
      iVar11 = iVar11 + (pIVar4->VtxBuffer).Size;
      (pIVar6->DrawData).TotalVtxCount = iVar11;
      iVar13 = iVar13 + (pIVar4->IdxBuffer).Size;
      (pIVar6->DrawData).TotalIdxCount = iVar13;
      uVar12 = uVar12 + 1;
    }
    (pIVar6->IO).MetricsRenderVertices = iVar11;
    (pIVar6->IO).MetricsRenderIndices = iVar13;
    if ((0 < (int)uVar2) &&
       (p_Var5 = (pIVar6->IO).RenderDrawListsFn, p_Var5 != (_func_void_ImDrawData_ptr *)0x0)) {
      (*p_Var5)(&pIVar6->DrawData);
    }
    return;
  }
  __assert_fail("g.Initialized",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                ,0x100e,"void ImGui::Render()");
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);   // Forgot to call ImGui::NewFrame()

    if (g.FrameCountEnded != g.FrameCount)
        ImGui::EndFrame();
    g.FrameCountRendered = g.FrameCount;

    // Gather windows to render
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = g.IO.MetricsActiveWindows = 0;
    g.DrawDataBuilder.Clear();
    ImGuiWindow* window_to_render_front_most = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget : NULL;
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (window->Active && window->HiddenFrames == 0 && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != window_to_render_front_most)
            AddWindowToDrawDataSelectLayer(window);
    }
    if (window_to_render_front_most && window_to_render_front_most->Active && window_to_render_front_most->HiddenFrames == 0) // NavWindowingTarget is always temporarily displayed as the front-most window
        AddWindowToDrawDataSelectLayer(window_to_render_front_most);
    g.DrawDataBuilder.FlattenIntoSingleLayer();

    // Draw software mouse cursor if requested
    ImVec2 offset, size, uv[4];
    if (g.IO.MouseDrawCursor && g.IO.Fonts->GetMouseCursorTexData(g.MouseCursor, &offset, &size, &uv[0], &uv[2]))
    {
        const ImVec2 pos = g.IO.MousePos - offset;
        const ImTextureID tex_id = g.IO.Fonts->TexID;
        const float sc = g.Style.MouseCursorScale;
        g.OverlayDrawList.PushTextureID(tex_id);
        g.OverlayDrawList.AddImage(tex_id, pos + ImVec2(1,0)*sc, pos+ImVec2(1,0)*sc + size*sc, uv[2], uv[3], IM_COL32(0,0,0,48));        // Shadow
        g.OverlayDrawList.AddImage(tex_id, pos + ImVec2(2,0)*sc, pos+ImVec2(2,0)*sc + size*sc, uv[2], uv[3], IM_COL32(0,0,0,48));        // Shadow
        g.OverlayDrawList.AddImage(tex_id, pos,                  pos + size*sc,                uv[2], uv[3], IM_COL32(0,0,0,255));       // Black border
        g.OverlayDrawList.AddImage(tex_id, pos,                  pos + size*sc,                uv[0], uv[1], IM_COL32(255,255,255,255)); // White fill
        g.OverlayDrawList.PopTextureID();
    }
    if (!g.OverlayDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.OverlayDrawList);

    // Setup ImDrawData structure for end-user
    SetupDrawData(&g.DrawDataBuilder.Layers[0], &g.DrawData);
    g.IO.MetricsRenderVertices = g.DrawData.TotalVtxCount;
    g.IO.MetricsRenderIndices = g.DrawData.TotalIdxCount;

    // Render. If user hasn't set a callback then they may retrieve the draw data via GetDrawData()
#ifndef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
    if (g.DrawData.CmdListsCount > 0 && g.IO.RenderDrawListsFn != NULL)
        g.IO.RenderDrawListsFn(&g.DrawData);
#endif
}